

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurveOnSurface.h
# Opt level: O2

void anurbs::
     CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
     ::register_python(module *m)

{
  string name;
  class_<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_anurbs::CurveBase<3L>,_std::shared_ptr<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>_>_>
  cStack_68;
  char *local_60 [4];
  arg local_40;
  arg local_30;
  arg local_20;
  
  CurveOnSurface<3l,std::shared_ptr<anurbs::NurbsCurveGeometry<2l>>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
  ::python_name_abi_cxx11_();
  pybind11::
  class_<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_anurbs::CurveBase<3L>,_std::shared_ptr<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>_>_>
  ::class_<>(&cStack_68,(m->super_object).super_handle.m_ptr,local_60[0]);
  local_20.name = "curve_geometry";
  local_20._8_1_ = 2;
  local_30.name = "surface_geometry";
  local_30._8_1_ = 2;
  local_40.name = "domain";
  local_40._8_1_ = 2;
  pybind11::detail::initimpl::
  constructor<std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>,_anurbs::Interval>
  ::
  execute<pybind11::class_<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_anurbs::CurveBase<3L>,_std::shared_ptr<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>_>_>,_pybind11::arg,_pybind11::arg,_pybind11::arg,_0>
            (&cStack_68,&local_20,&local_30,&local_40);
  pybind11::object::~object((object *)&cStack_68);
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

static void register_python(pybind11::module& m)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = CurveOnSurface<TDimension>;
        using Base = CurveBase<TDimension>;
        using Holder = Pointer<Type>;

        const std::string name = Type::python_name();

        py::class_<Type, Base, Holder>(m, name.c_str())
            .def(py::init<TCurveRef, TSurfaceRef,
                Interval>(), "curve_geometry"_a, "surface_geometry"_a,
                "domain"_a)
        ;
    }